

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.h
# Opt level: O3

void __thiscall slang::parsing::NumberParser::checkIntOverflow(NumberParser *this,Token token)

{
  LanguageVersion LVar1;
  Token token_00;
  logic_t lVar2;
  bool bVar3;
  char cVar4;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_40;
  uint local_38;
  ushort local_34;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  undefined8 local_20;
  Info *local_18;
  
  local_18 = token.info;
  local_20 = token._0_8_;
  LVar1 = this->languageVersion;
  Token::intValue((Token *)&local_30);
  local_40.val = 0x7fffffff;
  local_34 = 1;
  local_38 = 0x20;
  SVInt::clearUnusedBits((SVInt *)&local_40);
  lVar2 = SVInt::operator<=((SVInt *)&local_30,(SVInt *)&local_40);
  if ((int)LVar1 < 1) {
    cVar4 = lVar2.value == '\0';
    if (lVar2.value == '@') {
      cVar4 = -0x80;
    }
    if (lVar2.value == 0x80) {
      cVar4 = -0x80;
    }
    bVar3 = cVar4 != '\0' && (cVar4 != '@' && cVar4 != -0x80);
  }
  else {
    bVar3 = false;
  }
  if (((0x40 < local_38) || ((local_34 & 0x100) != 0)) && ((void *)local_40.val != (void *)0x0)) {
    operator_delete__(local_40.pVal);
  }
  if (((0x40 < local_28) || ((local_23 & 1) != 0)) && ((void *)local_30.val != (void *)0x0)) {
    operator_delete__(local_30.pVal);
  }
  if (bVar3) {
    token_00.info = local_18;
    token_00.kind = (undefined2)local_20;
    token_00._2_1_ = local_20._2_1_;
    token_00.numFlags.raw = local_20._3_1_;
    token_00.rawLen = local_20._4_4_;
    reportIntOverflow(this,token_00);
  }
  return;
}

Assistant:

void checkIntOverflow(Token token) {
        if (languageVersion < LanguageVersion::v1800_2023 && token.intValue() > INT32_MAX)
            reportIntOverflow(token);
    }